

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O1

void __thiscall
OpenMPDistScheduleClause::generateDOT
          (OpenMPDistScheduleClause *this,ofstream *dot_file,int depth,int index,string *parent_node
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  long *plVar8;
  undefined8 *puVar9;
  size_t sVar10;
  uint uVar11;
  long *plVar12;
  ulong *puVar13;
  size_type *psVar14;
  ulong uVar15;
  uint uVar16;
  undefined8 uVar17;
  uint uVar18;
  string __str_1;
  string __str;
  string chunk_size;
  string parameter_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  string clause_kind;
  string current_line;
  string indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  ulong *local_158;
  long local_150;
  ulong local_148;
  long lStack_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char *local_98;
  undefined8 local_90;
  char local_88;
  undefined7 uStack_87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  OpenMPDistScheduleClause *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_98 = &local_88;
  local_90 = 0;
  local_88 = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_58 = this;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)depth);
  uVar16 = -depth;
  if (0 < depth) {
    uVar16 = depth;
  }
  uVar18 = 1;
  if (9 < uVar16) {
    uVar15 = (ulong)uVar16;
    uVar6 = 4;
    do {
      uVar18 = uVar6;
      uVar11 = (uint)uVar15;
      if (uVar11 < 100) {
        uVar18 = uVar18 - 2;
        goto LAB_00171126;
      }
      if (uVar11 < 1000) {
        uVar18 = uVar18 - 1;
        goto LAB_00171126;
      }
      if (uVar11 < 10000) goto LAB_00171126;
      uVar15 = uVar15 / 10000;
      uVar6 = uVar18 + 4;
    } while (99999 < uVar11);
    uVar18 = uVar18 + 1;
  }
LAB_00171126:
  local_1b8 = &local_1a8;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)uVar18 - (char)(depth >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)depth >> 0x1f) + (long)local_1b8),uVar18,uVar16);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,0x1a888b);
  local_198 = &local_188;
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_188 = *plVar12;
    lStack_180 = plVar8[3];
  }
  else {
    local_188 = *plVar12;
    local_198 = (long *)*plVar8;
  }
  local_190 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_198);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_148 = *puVar13;
    lStack_140 = plVar8[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *puVar13;
    local_158 = (ulong *)*plVar8;
  }
  local_150 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  uVar16 = -index;
  if (0 < index) {
    uVar16 = index;
  }
  uVar18 = 1;
  if (9 < uVar16) {
    uVar15 = (ulong)uVar16;
    uVar6 = 4;
    do {
      uVar18 = uVar6;
      uVar11 = (uint)uVar15;
      if (uVar11 < 100) {
        uVar18 = uVar18 - 2;
        goto LAB_0017127a;
      }
      if (uVar11 < 1000) {
        uVar18 = uVar18 - 1;
        goto LAB_0017127a;
      }
      if (uVar11 < 10000) goto LAB_0017127a;
      uVar15 = uVar15 / 10000;
      uVar6 = uVar18 + 4;
    } while (99999 < uVar11);
    uVar18 = uVar18 + 1;
  }
LAB_0017127a:
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,(char)uVar18 - (char)(index >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_1d8._M_dataplus._M_p + ((uint)index >> 0x1f),uVar18,uVar16);
  uVar15 = 0xf;
  if (local_158 != &local_148) {
    uVar15 = local_148;
  }
  if (uVar15 < local_1d8._M_string_length + local_150) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      uVar17 = local_1d8.field_2._M_allocated_capacity;
    }
    if (local_1d8._M_string_length + local_150 <= (ulong)uVar17) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,(ulong)local_158);
      goto LAB_0017131c;
    }
  }
  puVar9 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_1d8._M_dataplus._M_p);
LAB_0017131c:
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  psVar14 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_b8.field_2._M_allocated_capacity = *psVar14;
    local_b8.field_2._8_8_ = puVar9[3];
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar14;
    local_b8._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_b8._M_string_length = puVar9[1];
  *puVar9 = psVar14;
  puVar9[1] = 0;
  *(undefined1 *)psVar14 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  std::operator+(&local_1d8,&local_78,parent_node);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_1a8 = *plVar12;
    lStack_1a0 = plVar8[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *plVar12;
    local_1b8 = (long *)*plVar8;
  }
  local_1b0 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1b8,(ulong)local_b8._M_dataplus._M_p);
  plVar12 = plVar8 + 2;
  if ((long *)*plVar8 == plVar12) {
    local_188 = *plVar12;
    lStack_180 = plVar8[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *plVar12;
    local_198 = (long *)*plVar8;
  }
  local_190 = plVar8[1];
  *plVar8 = (long)plVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_198);
  puVar13 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar13) {
    local_148 = *puVar13;
    lStack_140 = plVar8[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *puVar13;
    local_158 = (ulong *)*plVar8;
  }
  local_150 = plVar8[1];
  *plVar8 = (long)puVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_158);
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = local_98;
  iVar4 = (int)dot_file;
  if (local_98 == (char *)0x0) {
    std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)dot_file + -0x18));
  }
  else {
    sVar10 = strlen(local_98);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)dot_file,pcVar5,sVar10);
  }
  std::__cxx11::string::append((char *)&local_78);
  local_150 = 0;
  local_148 = local_148 & 0xffffffffffffff00;
  local_158 = &local_148;
  if (local_58->dist_schedule_kind == OMPC_DIST_SCHEDULE_KIND_static) {
    std::__cxx11::string::_M_replace((ulong)&local_158,0,(char *)0x0,0x1a8868);
  }
  if (local_150 != 0) {
    local_198 = &local_188;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    std::__cxx11::string::append((char *)&local_198);
    std::operator+(&local_138,&local_78,&local_b8);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_138);
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_168 = *plVar12;
      lStack_160 = plVar8[3];
      local_178 = &local_168;
    }
    else {
      local_168 = *plVar12;
      local_178 = (long *)*plVar8;
    }
    local_170 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_198);
    psVar14 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_1d8.field_2._M_allocated_capacity = *psVar14;
      local_1d8.field_2._8_8_ = plVar8[3];
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar14;
      local_1d8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_1d8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_1a8 = *plVar12;
      lStack_1a0 = plVar8[3];
      local_1b8 = &local_1a8;
    }
    else {
      local_1a8 = *plVar12;
      local_1b8 = (long *)*plVar8;
    }
    local_1b0 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_1b8);
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8,local_1a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,local_168 + 1);
    }
    paVar1 = &local_138.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar1) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = local_98;
    if (local_98 == (char *)0x0) {
      std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)dot_file + -0x18));
    }
    else {
      sVar10 = strlen(local_98);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)dot_file,pcVar5,sVar10);
    }
    local_f8 = &local_e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    std::__cxx11::string::append((char *)&local_f8);
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_198);
    local_d8 = &local_c8;
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_c8 = *plVar12;
      lStack_c0 = plVar8[3];
    }
    else {
      local_c8 = *plVar12;
      local_d8 = (long *)*plVar8;
    }
    local_d0 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    psVar14 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_118.field_2._M_allocated_capacity = *psVar14;
      local_118.field_2._8_8_ = plVar8[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar14;
      local_118._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_118._M_string_length = plVar8[1];
    *plVar8 = (long)psVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_198);
    psVar14 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_138.field_2._M_allocated_capacity = *psVar14;
      local_138.field_2._8_8_ = plVar8[3];
      local_138._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar14;
      local_138._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_138._M_string_length = plVar8[1];
    *plVar8 = (long)psVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_138);
    local_178 = &local_168;
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_168 = *plVar12;
      lStack_160 = plVar8[3];
    }
    else {
      local_168 = *plVar12;
      local_178 = (long *)*plVar8;
    }
    local_170 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_158);
    puVar13 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_1d8.field_2._M_allocated_capacity = *puVar13;
      local_1d8.field_2._8_8_ = plVar8[3];
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *puVar13;
      local_1d8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_1d8._M_string_length = plVar8[1];
    *plVar8 = (long)puVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_1d8);
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_1a8 = *plVar12;
      lStack_1a0 = plVar8[3];
      local_1b8 = &local_1a8;
    }
    else {
      local_1a8 = *plVar12;
      local_1b8 = (long *)*plVar8;
    }
    local_1b0 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_1b8);
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8,local_1a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,local_168 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar1) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    pcVar5 = local_98;
    if (local_98 == (char *)0x0) {
      std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)dot_file + -0x18));
    }
    else {
      sVar10 = strlen(local_98);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)dot_file,pcVar5,sVar10);
    }
    if (local_198 != &local_188) {
      operator_delete(local_198,local_188 + 1);
    }
  }
  local_198 = &local_188;
  pcVar3 = (local_58->chunk_size)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar3,pcVar3 + (local_58->chunk_size)._M_string_length);
  iVar7 = std::__cxx11::string::compare((char *)&local_198);
  if (iVar7 != 0) {
    std::__cxx11::string::_M_assign((string *)&local_158);
    local_1b8 = &local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
    std::__cxx11::string::append((char *)&local_1b8);
    std::operator+(&local_118,&local_78,&local_b8);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
    paVar1 = &local_138.field_2;
    psVar14 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_138.field_2._M_allocated_capacity = *psVar14;
      local_138.field_2._8_8_ = plVar8[3];
      local_138._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar14;
      local_138._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_138._M_string_length = plVar8[1];
    *plVar8 = (long)psVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_1b8);
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_168 = *plVar12;
      lStack_160 = plVar8[3];
      local_178 = &local_168;
    }
    else {
      local_168 = *plVar12;
      local_178 = (long *)*plVar8;
    }
    local_170 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_178);
    psVar14 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_1d8.field_2._M_allocated_capacity = *psVar14;
      local_1d8.field_2._8_8_ = plVar8[3];
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar14;
      local_1d8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_1d8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,local_168 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar1) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    paVar2 = &local_118.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    pcVar5 = local_98;
    if (local_98 == (char *)0x0) {
      std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)dot_file + -0x18));
    }
    else {
      sVar10 = strlen(local_98);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)dot_file,pcVar5,sVar10);
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    std::__cxx11::string::append((char *)local_50);
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)local_50,(ulong)local_1b8);
    local_f8 = &local_e8;
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_e8 = *plVar12;
      lStack_e0 = plVar8[3];
    }
    else {
      local_e8 = *plVar12;
      local_f8 = (long *)*plVar8;
    }
    local_f0 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_f8);
    local_d8 = &local_c8;
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_c8 = *plVar12;
      lStack_c0 = plVar8[3];
    }
    else {
      local_c8 = *plVar12;
      local_d8 = (long *)*plVar8;
    }
    local_d0 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_1b8);
    psVar14 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_118.field_2._M_allocated_capacity = *psVar14;
      local_118.field_2._8_8_ = plVar8[3];
      local_118._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar14;
      local_118._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_118._M_string_length = plVar8[1];
    *plVar8 = (long)psVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar14 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_138.field_2._M_allocated_capacity = *psVar14;
      local_138.field_2._8_8_ = plVar8[3];
      local_138._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar14;
      local_138._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_138._M_string_length = plVar8[1];
    *plVar8 = (long)psVar14;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_158);
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_168 = *plVar12;
      lStack_160 = plVar8[3];
      local_178 = &local_168;
    }
    else {
      local_168 = *plVar12;
      local_178 = (long *)*plVar8;
    }
    local_170 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_178);
    puVar13 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_1d8.field_2._M_allocated_capacity = *puVar13;
      local_1d8.field_2._8_8_ = plVar8[3];
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *puVar13;
      local_1d8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_1d8._M_string_length = plVar8[1];
    *plVar8 = (long)puVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_98,(string *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (local_178 != &local_168) {
      operator_delete(local_178,local_168 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar1) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    pcVar5 = local_98;
    if (local_98 == (char *)0x0) {
      std::ios::clear(iVar4 + (int)*(undefined8 *)(*(long *)dot_file + -0x18));
    }
    else {
      sVar10 = strlen(local_98);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)dot_file,pcVar5,sVar10);
    }
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8,local_1a8 + 1);
    }
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,local_148 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  return;
}

Assistant:

void OpenMPDistScheduleClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "dist_schedule_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    OpenMPDistScheduleClauseKind kind = this->getKind();
    std::string parameter_string;
    switch (kind) {
        case OMPC_DIST_SCHEDULE_KIND_static:
            parameter_string = "static";
            break;
        default:
            ;
    }
    if (parameter_string.size() > 0) {
        std::string node_id = clause_kind + "_kind";
        current_line = indent + clause_kind + " -- " + node_id + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + node_id + " [label = \"" + node_id + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };

    std::string chunk_size = this->getChunkSize();
    if (chunk_size != "") {
        parameter_string = chunk_size;
        std::string chunk_size_name = clause_kind + "_chunk_size";
        current_line = indent + clause_kind + " -- " + chunk_size_name + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + chunk_size_name + " [label = \"" + chunk_size_name + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    }; 
}